

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O1

void EpdAdd2(EpDouble *epd1,EpDouble *epd2)

{
  double dVar1;
  int iVar2;
  int __exponent;
  int iVar3;
  ulong uVar4;
  EpType val;
  double dVar5;
  EpTypeUnion EVar6;
  
  if ((SUB84(epd1->type,4) >> 0x14 < 0xfff ||
       ((ulong)epd1->type & 0xfffffffffffff) != 0x8000000000000) &&
     (((ulong)epd2->type & 0xfffffffffffff) != 0x8000000000000 ||
      (ulong)epd2->type < 0xfff0000000000000)) {
    uVar4 = (ulong)epd1->type & 0x7fffffffffffffff;
    if (uVar4 == 0x7ff0000000000000) {
LAB_0080d097:
      if (((ulong)epd2->type & 0x7fffffffffffffff) == 0x7ff0000000000000) {
        if (-1 < (long)((ulong)epd2->type ^ (ulong)epd1->type)) {
          return;
        }
        goto LAB_0080d0c8;
      }
    }
    else {
      if (((ulong)epd2->type & 0x7fffffffffffffff) != 0x7ff0000000000000) {
        if (((ulong)epd1->type & 0x7ff0000000000000) != 0x3ff0000000000000) {
          __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/epd/epd.c"
                        ,0x26b,"void EpdAdd2(EpDouble *, EpDouble *)");
        }
        if (((ulong)epd2->type & 0x7ff0000000000000) != 0x3ff0000000000000) {
          __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/epd/epd.c"
                        ,0x26c,"void EpdAdd2(EpDouble *, EpDouble *)");
        }
        iVar3 = epd1->exponent;
        iVar2 = epd2->exponent;
        __exponent = iVar3 - iVar2;
        if (__exponent == 0 || iVar3 < iVar2) {
          if (iVar3 < iVar2) {
            if (iVar2 - iVar3 < 0x400) {
              dVar1 = (epd1->type).value;
              dVar5 = ldexp(1.0,iVar2 - iVar3);
              EVar6.value = dVar1 / dVar5 + (epd2->type).value;
            }
            else {
              EVar6 = epd2->type;
            }
            iVar3 = epd2->exponent;
          }
          else {
            EVar6.value = (epd1->type).value + (epd2->type).value;
          }
        }
        else {
          EVar6 = (EpTypeUnion)(epd1->type).value;
          if (__exponent < 0x400) {
            dVar1 = (epd2->type).value;
            dVar5 = ldexp(1.0,__exponent);
            EVar6.value = EVar6.value + dVar1 / dVar5;
          }
          iVar3 = epd1->exponent;
        }
        (epd1->type).value = (double)EVar6;
        epd1->exponent = iVar3;
        EpdNormalize(epd1);
        return;
      }
      if (uVar4 == 0x7ff0000000000000) goto LAB_0080d097;
    }
    if (((ulong)epd2->type & 0x7fffffffffffffff) == 0x7ff0000000000000) {
      epd1->type = epd2->type;
      epd1->exponent = epd2->exponent;
    }
  }
  else {
LAB_0080d0c8:
    (epd1->type).value = -NAN;
    epd1->exponent = 0;
  }
  return;
}

Assistant:

void
EpdAdd2(EpDouble *epd1, EpDouble *epd2)
{
  double        value;
  int           exponent, diff;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    if (EpdIsInf(epd1) && EpdIsInf(epd2)) {
      sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
      if (sign == 1)
        EpdMakeNan(epd1);
    } else if (EpdIsInf(epd2)) {
      EpdCopy(epd2, epd1);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  if (epd1->exponent > epd2->exponent) {
    diff = epd1->exponent - epd2->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value +
                epd2->type.value / pow((double)2.0, (double)diff);
    } else
      value = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2->exponent) {
    diff = epd2->exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value / pow((double)2.0, (double)diff) +
                epd2->type.value;
    } else
      value = epd2->type.value;
    exponent = epd2->exponent;
  } else {
    value = epd1->type.value + epd2->type.value;
    exponent = epd1->exponent;
  }
  epd1->type.value = value;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}